

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Stack.h
# Opt level: O2

void __thiscall w3Stack::push_label(w3Stack *this,w3StackValue *value)

{
  undefined8 extraout_RAX;
  string sStack_28;
  
  if (value->tag == Tag_Label) {
    std::vector<w3StackValue,_std::allocator<w3StackValue>_>::push_back
              ((vector<w3StackValue,_std::allocator<w3StackValue>_> *)this,value);
    return;
  }
  StringFormat_abi_cxx11_(&sStack_28,"%X %X",(ulong)value->tag,0x81);
  AssertFailedFormat("value.tag == Tag_Label",&sStack_28);
  std::__cxx11::string::~string((string *)&sStack_28);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void push_label (const w3StackValue& value)
    {
        AssertFormat (value.tag == Tag_Label, ("%X %X", value.tag, Tag_Label));
        push (value);
        //printf ("push_label depth:%" FORMAT_SIZE "X\n", size ());
    }